

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.h
# Opt level: O2

string * GEO::String::to_string<int>(string *__return_storage_ptr__,int *value)

{
  ostringstream out;
  long local_190;
  undefined8 local_188 [46];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
  *(undefined8 *)((long)local_188 + *(long *)(local_190 + -0x18)) = 0x11;
  std::ostream::operator<<((ostringstream *)&local_190,*value);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
  return __return_storage_ptr__;
}

Assistant:

inline std::string to_string(const T& value) {
            std::ostringstream out;
	    // Makes sure that double-precision number are displayed
	    // with a sufficient number of digits. This is important
	    // to avoid losing precision when using ASCII files.
	    out << std::setprecision(17);
            out << value;
            return out.str();
        }